

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001ac4b0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001ac4b7._0_1_ = '.';
    uRam00000000001ac4b7._1_1_ = '.';
    uRam00000000001ac4b7._2_1_ = '.';
    uRam00000000001ac4b7._3_1_ = '.';
    uRam00000000001ac4b7._4_1_ = '.';
    uRam00000000001ac4b7._5_1_ = '.';
    uRam00000000001ac4b7._6_1_ = '.';
    uRam00000000001ac4b7._7_1_ = '.';
    DAT_001ac4a0 = '.';
    DAT_001ac4a0_1._0_1_ = '.';
    DAT_001ac4a0_1._1_1_ = '.';
    DAT_001ac4a0_1._2_1_ = '.';
    DAT_001ac4a0_1._3_1_ = '.';
    DAT_001ac4a0_1._4_1_ = '.';
    DAT_001ac4a0_1._5_1_ = '.';
    DAT_001ac4a0_1._6_1_ = '.';
    uRam00000000001ac4a8 = 0x2e2e2e2e2e2e2e;
    DAT_001ac4af = 0x2e;
    DAT_001ac490 = '.';
    DAT_001ac490_1._0_1_ = '.';
    DAT_001ac490_1._1_1_ = '.';
    DAT_001ac490_1._2_1_ = '.';
    DAT_001ac490_1._3_1_ = '.';
    DAT_001ac490_1._4_1_ = '.';
    DAT_001ac490_1._5_1_ = '.';
    DAT_001ac490_1._6_1_ = '.';
    uRam00000000001ac498._0_1_ = '.';
    uRam00000000001ac498._1_1_ = '.';
    uRam00000000001ac498._2_1_ = '.';
    uRam00000000001ac498._3_1_ = '.';
    uRam00000000001ac498._4_1_ = '.';
    uRam00000000001ac498._5_1_ = '.';
    uRam00000000001ac498._6_1_ = '.';
    uRam00000000001ac498._7_1_ = '.';
    DAT_001ac480 = '.';
    DAT_001ac480_1._0_1_ = '.';
    DAT_001ac480_1._1_1_ = '.';
    DAT_001ac480_1._2_1_ = '.';
    DAT_001ac480_1._3_1_ = '.';
    DAT_001ac480_1._4_1_ = '.';
    DAT_001ac480_1._5_1_ = '.';
    DAT_001ac480_1._6_1_ = '.';
    uRam00000000001ac488._0_1_ = '.';
    uRam00000000001ac488._1_1_ = '.';
    uRam00000000001ac488._2_1_ = '.';
    uRam00000000001ac488._3_1_ = '.';
    uRam00000000001ac488._4_1_ = '.';
    uRam00000000001ac488._5_1_ = '.';
    uRam00000000001ac488._6_1_ = '.';
    uRam00000000001ac488._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001ac478._0_1_ = '.';
    uRam00000000001ac478._1_1_ = '.';
    uRam00000000001ac478._2_1_ = '.';
    uRam00000000001ac478._3_1_ = '.';
    uRam00000000001ac478._4_1_ = '.';
    uRam00000000001ac478._5_1_ = '.';
    uRam00000000001ac478._6_1_ = '.';
    uRam00000000001ac478._7_1_ = '.';
    DAT_001ac4bf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}